

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandBlockPo(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Abc_Ntk_t *pNtk_00;
  Aig_Man_t *pAig_00;
  Abc_Ntk_t *pNtk_01;
  char *pcVar3;
  uint local_48;
  int fVerbose;
  int nCycles;
  int c;
  Aig_Man_t *pAig;
  Abc_Ntk_t *pNtkNew;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  local_48 = 0;
  bVar1 = false;
  Extra_UtilGetoptReset();
  do {
    while( true ) {
      iVar2 = Extra_UtilGetopt(argc,argv,"Fvh");
      if (iVar2 == -1) {
        pNtk_00 = Abc_FrameReadNtk(pAbc);
        if (pNtk_00 == (Abc_Ntk_t *)0x0) {
          Abc_Print(1,"Main AIG: There is no current network.\n");
          return 0;
        }
        iVar2 = Abc_NtkIsStrash(pNtk_00);
        if (iVar2 == 0) {
          Abc_Print(1,"Main AIG: The current network is not an AIG.\n");
          return 0;
        }
        if (local_48 == 0) {
          Abc_Print(1,"The number of time frame is 0. The circuit is left unchanged.\n");
          return 0;
        }
        pAig_00 = Abc_NtkToDar(pNtk_00,0,1);
        Saig_ManBlockPo(pAig_00,local_48);
        pNtk_01 = Abc_NtkFromAigPhase(pAig_00);
        Aig_ManStop(pAig_00);
        pcVar3 = Extra_UtilStrsav(pNtk_00->pName);
        pNtk_01->pName = pcVar3;
        pcVar3 = Extra_UtilStrsav(pNtk_00->pSpec);
        pNtk_01->pSpec = pcVar3;
        Abc_FrameReplaceCurrentNetwork(pAbc,pNtk_01);
        return 0;
      }
      if (iVar2 == 0x46) break;
      if (iVar2 == 0x68) goto LAB_0029b6a3;
      if (iVar2 != 0x76) {
        Abc_Print(-2,"Unknown switch.\n");
        goto LAB_0029b6a3;
      }
      bVar1 = (bool)(bVar1 ^ 1);
    }
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
      break;
    }
    local_48 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = globalUtilOptind + 1;
  } while (-1 < (int)local_48);
LAB_0029b6a3:
  Abc_Print(-2,"usage: blockpo [-F num] [-fvh]\n");
  Abc_Print(-2,"\t         forces the miter outputs to be \"true\" in the first F frames\n");
  Abc_Print(-2,"\t-F num : the number of time frames [default = %d]\n",(ulong)local_48);
  pcVar3 = "no";
  if (bVar1) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-v     : toggle printing optimization summary [default = %s]\n",pcVar3);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
}

Assistant:

int Abc_CommandBlockPo( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkNew = NULL;
    Aig_Man_t * pAig;
    int c;
    int nCycles = 0;
    int fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Fvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            nCycles = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nCycles < 0 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            Abc_Print( -2, "Unknown switch.\n");
            goto usage;
        }
    }

    // check the main AIG
    pNtk = Abc_FrameReadNtk(pAbc);
    if ( pNtk == NULL )
    {
        Abc_Print( 1, "Main AIG: There is no current network.\n");
        return 0;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( 1, "Main AIG: The current network is not an AIG.\n");
        return 0;
    }
    if ( nCycles == 0 )
    {
        Abc_Print( 1, "The number of time frame is 0. The circuit is left unchanged.\n" );
        return 0;
    }

    // transform
    pAig = Abc_NtkToDar( pNtk, 0, 1 );
    Saig_ManBlockPo( pAig, nCycles );
    pNtkNew = Abc_NtkFromAigPhase( pAig );
    Aig_ManStop( pAig );
    // transfer the name
    pNtkNew->pName = Extra_UtilStrsav(pNtk->pName);
    pNtkNew->pSpec = Extra_UtilStrsav(pNtk->pSpec);
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkNew );
    return 0;

usage:
    Abc_Print( -2, "usage: blockpo [-F num] [-fvh]\n" );
    Abc_Print( -2, "\t         forces the miter outputs to be \"true\" in the first F frames\n" );
    Abc_Print( -2, "\t-F num : the number of time frames [default = %d]\n", nCycles );
    Abc_Print( -2, "\t-v     : toggle printing optimization summary [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}